

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall google::protobuf::anon_unknown_1::Symbol::GetFile(Symbol *this)

{
  FileDescriptor *in_RSI;
  
  switch((int)this) {
  case 1:
  case 3:
  case 5:
    break;
  case 2:
    return *(FileDescriptor **)(in_RSI + 0x20);
  case 4:
    in_RSI = *(FileDescriptor **)(in_RSI + 0x18);
    break;
  case 6:
    in_RSI = *(FileDescriptor **)(in_RSI + 0x10);
    break;
  case 7:
    goto switchD_001caab2_caseD_7;
  default:
    return (FileDescriptor *)0x0;
  }
  in_RSI = *(FileDescriptor **)(in_RSI + 0x10);
switchD_001caab2_caseD_7:
  return in_RSI;
}

Assistant:

const FileDescriptor* GetFile() const {
    switch (type) {
      case NULL_SYMBOL: return NULL;
      case MESSAGE    : return descriptor           ->file();
      case FIELD      : return field_descriptor     ->file();
      case ENUM       : return enum_descriptor      ->file();
      case ENUM_VALUE : return enum_value_descriptor->type()->file();
      case SERVICE    : return service_descriptor   ->file();
      case METHOD     : return method_descriptor    ->service()->file();
      case PACKAGE    : return package_file_descriptor;
    }
    return NULL;
  }